

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O1

void opengv::absolute_pose::modules::gp3p::sPolynomial43
               (Matrix<double,_48,_85,_0,_48,_85> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
          m_storage.m_data.array[0xbef];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x38b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xc4f] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
          m_storage.m_data.array[0xc50];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[1099] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xcb0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x47b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xce0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x4db] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xcaf] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xd10] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x53b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xd0f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x6eb] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xda0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x71b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xdd0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x77b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xd9f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe00] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x7db] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xdff] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x80b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe30] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x86b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe2f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x8cb] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe60] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x92b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe5f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x9bb] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe90] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xa1b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe8f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xadb] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xec0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xb0b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xef0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xb6b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xebf] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf20] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xbcb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf1f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xbfb] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xf50] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xc5b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf4f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xcbb] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xf80] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xd1b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf7f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xdab] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xfb0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xe0b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfaf] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xecb] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xfe0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xf2b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfdf] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::sPolynomial43( Eigen::Matrix<double,48,85> & groebnerMatrix )
{
  groebnerMatrix(43,18) = groebnerMatrix(31,65)/(groebnerMatrix(31,63));
  groebnerMatrix(43,22) = -groebnerMatrix(32,67)/(groebnerMatrix(32,65));
  groebnerMatrix(43,23) = -groebnerMatrix(32,68)/(groebnerMatrix(32,65));
  groebnerMatrix(43,25) = (groebnerMatrix(31,67)/(groebnerMatrix(31,63))-groebnerMatrix(32,69)/(groebnerMatrix(32,65)));
  groebnerMatrix(43,27) = groebnerMatrix(31,69)/(groebnerMatrix(31,63));
  groebnerMatrix(43,36) = -groebnerMatrix(32,72)/(groebnerMatrix(32,65));
  groebnerMatrix(43,37) = -groebnerMatrix(32,73)/(groebnerMatrix(32,65));
  groebnerMatrix(43,39) = (groebnerMatrix(31,72)/(groebnerMatrix(31,63))-groebnerMatrix(32,74)/(groebnerMatrix(32,65)));
  groebnerMatrix(43,41) = groebnerMatrix(31,74)/(groebnerMatrix(31,63));
  groebnerMatrix(43,42) = -groebnerMatrix(32,75)/(groebnerMatrix(32,65));
  groebnerMatrix(43,44) = groebnerMatrix(31,75)/(groebnerMatrix(31,63));
  groebnerMatrix(43,46) = -groebnerMatrix(32,76)/(groebnerMatrix(32,65));
  groebnerMatrix(43,48) = groebnerMatrix(31,76)/(groebnerMatrix(31,63));
  groebnerMatrix(43,51) = -groebnerMatrix(32,77)/(groebnerMatrix(32,65));
  groebnerMatrix(43,53) = groebnerMatrix(31,77)/(groebnerMatrix(31,63));
  groebnerMatrix(43,57) = -groebnerMatrix(32,78)/(groebnerMatrix(32,65));
  groebnerMatrix(43,58) = -groebnerMatrix(32,79)/(groebnerMatrix(32,65));
  groebnerMatrix(43,60) = (groebnerMatrix(31,78)/(groebnerMatrix(31,63))-groebnerMatrix(32,80)/(groebnerMatrix(32,65)));
  groebnerMatrix(43,62) = groebnerMatrix(31,80)/(groebnerMatrix(31,63));
  groebnerMatrix(43,63) = -groebnerMatrix(32,81)/(groebnerMatrix(32,65));
  groebnerMatrix(43,65) = groebnerMatrix(31,81)/(groebnerMatrix(31,63));
  groebnerMatrix(43,67) = -groebnerMatrix(32,82)/(groebnerMatrix(32,65));
  groebnerMatrix(43,69) = groebnerMatrix(31,82)/(groebnerMatrix(31,63));
  groebnerMatrix(43,72) = -groebnerMatrix(32,83)/(groebnerMatrix(32,65));
  groebnerMatrix(43,74) = groebnerMatrix(31,83)/(groebnerMatrix(31,63));
  groebnerMatrix(43,78) = -groebnerMatrix(32,84)/(groebnerMatrix(32,65));
  groebnerMatrix(43,80) = groebnerMatrix(31,84)/(groebnerMatrix(31,63));
}